

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkPointSpline::ChLinkPointSpline(ChLinkPointSpline *this,ChLinkPointSpline *other)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock,&other->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkPointSpline_01166c10;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar1 = (*(((other->trajectory_line).
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChGeometry)._vptr_ChGeometry[2])();
  std::__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::geometry::ChLine,void>
            ((__shared_ptr<chrono::geometry::ChLine,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChLine *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->trajectory_line).
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  this->tolerance = other->tolerance;
  return;
}

Assistant:

ChLinkPointSpline::ChLinkPointSpline(const ChLinkPointSpline& other) : ChLinkLockLock(other) {
    trajectory_line = std::shared_ptr<ChLine>((ChLine*)other.trajectory_line->Clone());  // deep copy
    tolerance = other.tolerance;
}